

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

void Js::JavascriptObject::CopyDataPropertiesForGenericObjects<false>
               (RecyclableObject *from,RecyclableObject *to,BVSparse<Memory::Recycler> *excluded,
               ScriptContext *scriptContext)

{
  BOOLEAN BVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  EnumeratorCache *pEVar5;
  JavascriptString *propertyString;
  PropertyString *owner;
  undefined1 auStack_d8 [8];
  JavascriptStaticEnumerator enumerator;
  undefined1 local_88 [8];
  PropertyRecord *propertyRecord;
  InlineCache *local_78;
  PolymorphicInlineCache *pPStack_70;
  FunctionBody *local_68;
  RecyclableObject *pRStack_60;
  PropertyRecordUsageCache *local_58;
  uint local_50;
  bool local_4b;
  RecyclableObject *local_48;
  Var local_40;
  Var propValue;
  PropertyId nextKey;
  
  local_48 = to;
  pEVar5 = JavascriptLibrary::GetObjectAssignCache
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,(from->type).ptr);
  auStack_d8 = (undefined1  [8])0x0;
  enumerator.propertyEnumerator.scriptContext.ptr = (ScriptContext *)0x0;
  enumerator.propertyEnumerator.object.ptr = (DynamicObject *)0x0;
  enumerator.propertyEnumerator.enumeratedCount = 0;
  enumerator.propertyEnumerator.flags = None;
  enumerator.propertyEnumerator._37_3_ = 0;
  enumerator.propertyEnumerator.cachedData.ptr = (CachedData *)0x0;
  enumerator.currentEnumerator.ptr = (JavascriptEnumerator *)0x0;
  enumerator.prefixEnumerator.ptr = (JavascriptEnumerator *)0x0;
  JavascriptStaticEnumerator::Clear
            ((JavascriptStaticEnumerator *)auStack_d8,None,(ScriptContext *)0x0);
  iVar3 = (*(from->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x2b])
                    (from,(JavascriptStaticEnumerator *)auStack_d8,0xe,scriptContext,pEVar5);
  if (iVar3 != 0) {
    propValue._4_4_ = 0xffffffff;
    local_40 = (Var)0x0;
    propertyString =
         JavascriptStaticEnumerator::MoveAndGetNext
                   ((JavascriptStaticEnumerator *)auStack_d8,(PropertyId *)((long)&propValue + 4),
                    (PropertyAttributes *)0x0);
    while (propertyString != (JavascriptString *)0x0) {
      if (propValue._4_4_ == 0xffffffff) {
        local_88 = (undefined1  [8])0x0;
        ScriptContext::GetOrAddPropertyRecord
                  (scriptContext,propertyString,(PropertyRecord **)local_88);
        propValue._4_4_ = *(Type *)((long)local_88 + 8);
      }
      if ((excluded == (BVSparse<Memory::Recycler> *)0x0) ||
         (BVar1 = BVSparse<Memory::Recycler>::Test(excluded,propValue._4_4_), BVar1 == '\0')) {
        bVar2 = VarIsImpl<Js::PropertyString>(&propertyString->super_RecyclableObject);
        if (bVar2) {
          owner = UnsafeVarTo<Js::PropertyString,Js::JavascriptString>(propertyString);
        }
        else {
          owner = (PropertyString *)0x0;
        }
        local_88 = (undefined1  [8])0x0;
        propertyRecord = (PropertyRecord *)0x50000ffff;
        local_58 = (PropertyRecordUsageCache *)0x0;
        local_68 = (FunctionBody *)0x0;
        pRStack_60 = (RecyclableObject *)0x0;
        local_78 = (InlineCache *)0x0;
        pPStack_70 = (PolymorphicInlineCache *)0x0;
        local_50 = 0xffffffff;
        local_4b = true;
        if ((((owner == (PropertyString *)0x0) ||
             (bVar2 = PropertyRecordUsageCache::TryGetPropertyFromCache<true,false,false>
                                (&owner->propertyRecordUsageCache,from,from,&local_40,scriptContext,
                                 (PropertyValueInfo *)local_88,(RecyclableObject *)owner,
                                 (PropertyCacheOperationInfo *)0x0), !bVar2)) &&
            (BVar4 = JavascriptOperators::GetOwnProperty
                               (from,propValue._4_4_,&local_40,scriptContext,
                                (PropertyValueInfo *)local_88), BVar4 == 0)) ||
           (BVar4 = CreateDataProperty(local_48,propValue._4_4_,local_40,scriptContext), BVar4 == 0)
           ) {
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec36,L"Object.Spread");
        }
      }
      propertyString =
           JavascriptStaticEnumerator::MoveAndGetNext
                     ((JavascriptStaticEnumerator *)auStack_d8,(PropertyId *)((long)&propValue + 4),
                      (PropertyAttributes *)0x0);
    }
  }
  return;
}

Assistant:

void JavascriptObject::CopyDataPropertiesForGenericObjects(RecyclableObject* from, RecyclableObject* to, const BVSparse<Recycler>* excluded, ScriptContext* scriptContext)
{
    // Steps 4 and 5 of CopyDataPropertiesHelper

    EnumeratorCache* cache = scriptContext->GetLibrary()->GetObjectAssignCache(from->GetType());
    JavascriptStaticEnumerator enumerator;
    if (!from->GetEnumerator(&enumerator, EnumeratorFlags::SnapShotSemantics | EnumeratorFlags::EnumSymbols | EnumeratorFlags::UseCache, scriptContext, cache))
    {
        // Nothing to enumerate, continue with the nextSource.
        return;
    }

    PropertyId nextKey = Constants::NoProperty;
    Var propValue = nullptr;
    JavascriptString * propertyName = nullptr;

    // Enumerate through each property of properties and fetch the property descriptor
    while ((propertyName = enumerator.MoveAndGetNext(nextKey)) != NULL)
    {
        // Make sure nextKey is defined for the current propertyName
        if (nextKey == Constants::NoProperty)
        {
            PropertyRecord const * propertyRecord = nullptr;

            scriptContext->GetOrAddPropertyRecord(propertyName, &propertyRecord);
            nextKey = propertyRecord->GetPropertyId();
        }

        bool found = false;
        if (excluded)
        {
            found = excluded->Test(nextKey);
        }
        if (!found)
        {
            PropertyString * propertyString = JavascriptOperators::TryFromVar<PropertyString>(propertyName);

            // If propertyName is a PropertyString* we can try getting the property from the inline cache to avoid having a full property lookup
            //
            // Whenever possible, our enumerator populates the cache, so we should generally get a cache hit here
            PropertyValueInfo getPropertyInfo;
            if (propertyString == nullptr || !propertyString->TryGetPropertyFromCache<true /* OwnPropertyOnly */, false /* OutputExistence */>(from, from, &propValue, scriptContext, &getPropertyInfo))
            {
                if (!JavascriptOperators::GetOwnProperty(from, nextKey, &propValue, scriptContext, &getPropertyInfo))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                }
            }

            if (assign)
            {
                // Similarly, try to set the property using our cache to avoid having to do the full work of SetProperty
                PropertyValueInfo setPropertyInfo;
                if (propertyString == nullptr || !propertyString->TrySetPropertyFromCache(to, propValue, scriptContext, PropertyOperation_ThrowIfNonWritable, &setPropertyInfo))
                {
                    if (!JavascriptOperators::SetProperty(to, to, nextKey, propValue, &setPropertyInfo, scriptContext, PropertyOperation_ThrowIfNonWritable))
                    {
                        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                    }
                }
            }
            else
            {
                //TODO[t-huyan]: potentially use caching to improve efficiency? (see AssignForGenericObjects implementation)
                if (!CreateDataProperty(to, nextKey, propValue, scriptContext))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                }
            }
        }
    }
}